

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O2

void __thiscall HydEngine::advance(HydEngine *this,int *tstep)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  *tstep = 0;
  if (this->engineState == INITIALIZED) {
    this->hydStep = 0;
    iVar3 = (this->network->options).timeOptions[8] - this->currentTime;
    iVar2 = 0;
    if (this->halted != false) {
      iVar3 = 0;
    }
    if (0 < iVar3) {
      iVar1 = getTimeStep(this);
      iVar2 = iVar3;
      if (iVar1 < iVar3) {
        iVar2 = iVar1;
      }
      this->hydStep = iVar2;
    }
    *tstep = iVar2;
    updateEnergyUsage(this);
    updateTanks(this);
    iVar2 = this->currentTime + this->hydStep;
    this->currentTime = iVar2;
    if (this->rptTime <= iVar2) {
      this->rptTime = this->rptTime + (this->network->options).timeOptions[5];
    }
    updatePatterns(this);
    return;
  }
  return;
}

Assistant:

void HydEngine::advance(int* tstep)
{
    *tstep = 0;
    if ( engineState != HydEngine::INITIALIZED ) return;

    // ... save current results to hydraulics file
    //if ( saveToFile ) errcode = hydWriter.writeResults(hydState, hydTime);

    // ... if time remains, find time (hydStep) until next hydraulic event

    hydStep = 0;
    int timeLeft = network->option(Options::TOTAL_DURATION) - currentTime;
    if ( halted ) timeLeft = 0;
    if ( timeLeft > 0  )
    {
        hydStep = getTimeStep();
        if ( hydStep > timeLeft ) hydStep = timeLeft;
    }
    *tstep = hydStep;

    // ... update energy usage and tank levels over the time step

    updateEnergyUsage();
    updateTanks();

    // ... advance time counters

    currentTime += hydStep;
    if ( currentTime >= rptTime )
    {
        rptTime += network->option(Options::REPORT_STEP);
    }

    // ... advance time patterns

    updatePatterns();
}